

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

LispPTR COM_finish_finfo(LispPTR *args)

{
  FINFO *pFVar1;
  int iVar2;
  LispPTR *pLVar3;
  DFINFO *pDVar4;
  uint local_40;
  uint local_3c;
  FINFO *local_38;
  FINFO *lastp;
  int finfoid;
  FINFO *fp;
  DFINFO *dfp;
  LispPTR *args_local;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = &Dummy_errno;
    if ((*args & 0xfff0000) == 0xe0000) {
      local_3c = *args & 0xffff;
    }
    else {
      if ((*args & 0xfff0000) == 0xf0000) {
        local_40 = *args | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(*args);
        local_40 = *pLVar3;
      }
      local_3c = local_40;
    }
    if (((int)local_3c < 0) || (MAXFINFO + -1 < (int)local_3c)) {
      args_local._4_4_ = 0;
    }
    else {
      pDVar4 = FinfoArray + (int)local_3c;
      pFVar1 = pDVar4->head;
      if (pFVar1 == (FINFO *)0x0) {
        pDVar4->next = (FINFO *)0x0;
        args_local._4_4_ = 0;
      }
      else {
        pDVar4->head = (FINFO *)0x0;
        pDVar4->next = (FINFO *)0x0;
        for (local_38 = pFVar1; local_38->next != (finfo *)0x0; local_38 = local_38->next) {
        }
        local_38->next = FreeFinfoList;
        args_local._4_4_ = 0x4c;
        FreeFinfoList = pFVar1;
      }
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_finish_finfo(LispPTR *args)
{
  DFINFO *dfp;
  FINFO *fp;
  int finfoid;

  ERRSETJMP(NIL);

  Lisp_errno = &Dummy_errno;

  finfoid = LispNumToCInt(args[0]);

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (NIL);

  dfp = &FinfoArray[finfoid];
  if ((fp = dfp->head) == (FINFO *)0) {
    dfp->next = (FINFO *)0;
    return (NIL);
  }

  dfp->head = (FINFO *)0;
  dfp->next = (FINFO *)0;
  FreeFinfo(fp);

  return (ATOM_T);
}